

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::context
          (context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *data)

{
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data_local;
  context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  basic_context(&this->
                 super_basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
  (this->
  super_basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_basic_context = (_func_int **)&PTR__context_0047f270;
  Catch::clara::std::
  vector<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::vector(&this->items_);
  (*(this->
    super_basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    )._vptr_basic_context[2])(this,data);
  return;
}

Assistant:

context(const basic_data<string_type>* data) {
        push(data);
    }